

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

string * __thiscall
cfd::core::DescriptorKeyInfo::GetBip32Path_abi_cxx11_
          (string *__return_storage_ptr__,DescriptorKeyInfo *this)

{
  DescriptorKeyInfo *this_local;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->path_);
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorKeyInfo::GetBip32Path() const { return path_; }